

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void play_sysex(uint8_t *msg,uint len)

{
  uint address_00;
  Player *pPVar1;
  uint datalen;
  uint8_t *data;
  uint address;
  uint8_t mode;
  uint8_t model;
  uint8_t manufacturer;
  Player *player;
  uint len_local;
  uint8_t *msg_local;
  
  if ((((3 < len) && (*msg == 0xf0)) && (msg[len - 1] == 0xf7)) &&
     ((msg[2] == sysex_device_id || (msg[2] == '\x7f')))) {
    pPVar1 = active_player();
    if (msg[1] == 'A') {
      if (9 < len) {
        address_00 = (uint)msg[5] << 0x10 | (uint)msg[6] << 8 | (uint)msg[7];
        if (msg[4] == '\x12') {
          if (msg[3] == 'B') {
            play_roland_sysex(address_00,msg + 8,len - 10);
          }
          else if (msg[3] == 'E') {
            play_roland_sc_sysex(address_00,msg + 8,len - 10);
          }
        }
      }
    }
    else if (msg[1] == '\x7f') {
      (*pPVar1->_vptr_Player[0x1b])(pPVar1,msg,(ulong)len);
    }
  }
  return;
}

Assistant:

void play_sysex(const uint8_t *msg, unsigned len)
{
    if (len < 4 || msg[0] != 0xf0 || msg[len - 1] != 0xf7 ||
        (msg[2] != sysex_device_id && msg[2] != sysex_broadcast_id))
        return;

    Player &player = active_player();
    uint8_t manufacturer = msg[1];
    switch (manufacturer) {
        case 0x7f: // Universal realtime
            player.rt_system_exclusive(msg, len);
            break;
        case 0x41:  // Roland
            if (len < 10)
                break;
            else {
                uint8_t model = msg[3];
                uint8_t mode = msg[4];
                unsigned address = (msg[5] << 16) | (msg[6] << 8) | msg[7];
                // uint8_t checksum = msg[len - 2];
                if (mode == 0x12) {  // receive
                    const uint8_t *data = &msg[8];
                    unsigned datalen = len - 10;
                    switch (model) {
                    case 0x42:
                        play_roland_sysex(address, data, datalen); break;
                    case 0x45:
                        play_roland_sc_sysex(address, data, datalen); break;
                    }
                }
            }
            break;
    }
}